

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O3

SplittingStepCoefficients
SplittingStepCoefficients_Alloc(int sequential_methods,int stages,int partitions)

{
  SplittingStepCoefficients pSVar1;
  sunrealtype *psVar2;
  sunrealtype ***pppsVar3;
  sunrealtype **ppsVar4;
  ulong uVar5;
  ulong __nmemb;
  sunrealtype *psVar6;
  int j;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  SplittingStepCoefficients coefficients;
  SplittingStepCoefficients local_30;
  
  if (partitions < 1 || (stages < 1 || sequential_methods < 1)) {
    return (SplittingStepCoefficients)0x0;
  }
  pSVar1 = (SplittingStepCoefficients)malloc(0x20);
  if (pSVar1 != (SplittingStepCoefficients)0x0) {
    pSVar1->sequential_methods = sequential_methods;
    pSVar1->stages = stages;
    pSVar1->partitions = partitions;
    pSVar1->order = 0;
    __nmemb = (ulong)(uint)sequential_methods;
    local_30 = pSVar1;
    psVar2 = (sunrealtype *)calloc(__nmemb,8);
    pSVar1->alpha = psVar2;
    if (psVar2 != (sunrealtype *)0x0) {
      pppsVar3 = (sunrealtype ***)malloc(__nmemb * 8);
      pSVar1->beta = pppsVar3;
      if (pppsVar3 != (sunrealtype ***)0x0) {
        uVar8 = sequential_methods * (stages + 1U);
        ppsVar4 = (sunrealtype **)malloc((ulong)uVar8 * 8);
        if (ppsVar4 != (sunrealtype **)0x0) {
          uVar9 = (ulong)(stages + 1U);
          uVar5 = 0;
          do {
            local_30->beta[uVar5] = ppsVar4;
            uVar5 = uVar5 + 1;
            ppsVar4 = ppsVar4 + uVar9;
          } while (__nmemb != uVar5);
          psVar2 = (sunrealtype *)calloc((ulong)(uVar8 * partitions),8);
          if (psVar2 != (sunrealtype *)0x0) {
            uVar5 = 0;
            do {
              uVar7 = 0;
              psVar6 = psVar2;
              do {
                local_30->beta[uVar5][uVar7] = psVar6;
                uVar7 = uVar7 + 1;
                psVar6 = psVar6 + (uint)partitions;
              } while (uVar9 != uVar7);
              uVar5 = uVar5 + 1;
              psVar2 = psVar2 + (uint)partitions * uVar9;
            } while (uVar5 != __nmemb);
            return local_30;
          }
        }
      }
    }
    SplittingStepCoefficients_Destroy(&local_30);
  }
  return (SplittingStepCoefficients)0x0;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Alloc(
  const int sequential_methods, const int stages, const int partitions)
{
  if (sequential_methods < 1 || stages < 1 || partitions < 1) { return NULL; }

  SplittingStepCoefficients coefficients =
    (SplittingStepCoefficients)malloc(sizeof(*coefficients));
  if (coefficients == NULL) { return NULL; }

  coefficients->sequential_methods = sequential_methods;
  coefficients->stages             = stages;
  coefficients->partitions         = partitions;
  coefficients->order              = 0;

  coefficients->alpha = (sunrealtype*)calloc(sequential_methods,
                                             sizeof(*coefficients->alpha));
  if (coefficients->alpha == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* In order for beta to be indexed like beta[i][j][k], we can't use a single
     malloc. The j index requires allocating a matrix of pointers into beta. The
     i index requires allocating an array of pointers into that matrix. */

  /* Array of pointers for index i */
  coefficients->beta =
    (sunrealtype***)malloc(sequential_methods * sizeof(*coefficients->beta));
  if (coefficients->beta == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* Matrix of pointers for index j */
  sunrealtype** beta_cols = (sunrealtype**)malloc(
    sequential_methods * (stages + 1) * sizeof(*beta_cols));
  if (beta_cols == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  for (int i = 0; i < sequential_methods; i++)
  {
    coefficients->beta[i] = &beta_cols[i * (stages + 1)];
  }

  /* Contiguous memory to store the beta tensor -- use calloc so only non-zero
   * coefficients need to be set */
  sunrealtype* beta_mem =
    (sunrealtype*)calloc(sequential_methods * (stages + 1) * partitions,
                         sizeof(*beta_mem));
  if (beta_mem == NULL)
  {
    SplittingStepCoefficients_Destroy(&coefficients);
    return NULL;
  }

  /* Set pointers into the beta tensor */
  for (int i = 0; i < sequential_methods; i++)
  {
    for (int j = 0; j <= stages; j++)
    {
      coefficients->beta[i][j] = &beta_mem[(i * (stages + 1) + j) * partitions];
    }
  }

  return coefficients;
}